

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O0

void __thiscall QFormLayout::setWidget(QFormLayout *this,int row,ItemRole role,QWidget *widget)

{
  int iVar1;
  QFormLayoutPrivate *widget_00;
  undefined8 in_RCX;
  undefined4 in_EDX;
  int in_ESI;
  QFormLayoutPrivate *in_RDI;
  int rowCnt;
  QFormLayoutPrivate *d;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  
  widget_00 = d_func((QFormLayout *)0x4b87b9);
  iVar1 = rowCount((QFormLayout *)in_RDI);
  if (iVar1 <= in_ESI) {
    QFormLayoutPrivate::insertRows(in_RDI,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
  }
  QFormLayoutPrivate::setWidget
            ((QFormLayoutPrivate *)CONCAT44(in_ESI,in_EDX),(int)((ulong)in_RCX >> 0x20),
             (ItemRole)in_RCX,(QWidget *)widget_00);
  return;
}

Assistant:

void QFormLayout::setWidget(int row, ItemRole role, QWidget *widget)
{
    Q_D(QFormLayout);
    int rowCnt = rowCount();
    if (row >= rowCnt)
        d->insertRows(rowCnt, row - rowCnt + 1);
    d->setWidget(row, role, widget);
}